

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O3

bool Limonp::utf8ToUnicode
               (char *str,uint len,vector<unsigned_short,_std::allocator<unsigned_short>_> *vec)

{
  byte bVar1;
  pointer puVar2;
  iterator iVar3;
  int iVar4;
  ulong in_RAX;
  ushort uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  undefined8 uStack_38;
  
  if (str == (char *)0x0) {
LAB_001101ef:
    bVar6 = false;
  }
  else {
    puVar2 = (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    bVar6 = true;
    if (len != 0) {
      uVar8 = 0;
      uStack_38 = in_RAX;
      do {
        bVar1 = str[uVar8];
        if ((char)bVar1 < '\0') {
          if (bVar1 < 0xe0) {
            if ((uint)(uVar8 + 1) < len) {
              uVar5 = (bVar1 & 0x1c) << 6 | (ushort)(byte)(bVar1 << 6) | (byte)str[uVar8 + 1] & 0x3f
              ;
              uStack_38._0_6_ = CONCAT24(uVar5,(undefined4)uStack_38);
              iVar3._M_current =
                   (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                  .super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (vec,iVar3,(unsigned_short *)((long)&uStack_38 + 4));
              }
              else {
                *iVar3._M_current = uVar5;
                (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              iVar4 = 2;
              goto LAB_001101e1;
            }
          }
          else if (0xef < bVar1) goto LAB_001101ef;
          uVar7 = (int)uVar8 + 2;
          if (len <= uVar7) goto LAB_001101ef;
          uVar5 = (ushort)(byte)((byte)str[uVar8 + 1] >> 2 & 0xf | bVar1 << 4) << 8 |
                  (ushort)(byte)(str[uVar8 + 1] << 6) | (byte)str[uVar7] & 0x3f;
          uStack_38._0_4_ = CONCAT22(uVar5,(undefined2)uStack_38);
          iVar3._M_current =
               (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>(vec,iVar3,(unsigned_short *)((long)&uStack_38 + 2));
          }
          else {
            *iVar3._M_current = uVar5;
            (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar4 = 3;
        }
        else {
          uStack_38 = (ulong)CONCAT16(bVar1,(undefined6)uStack_38);
          iVar3._M_current =
               (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>(vec,iVar3,(unsigned_short *)((long)&uStack_38 + 6));
          }
          else {
            *iVar3._M_current = (ushort)bVar1;
            (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar4 = 1;
        }
LAB_001101e1:
        uVar7 = (int)uVar8 + iVar4;
        uVar8 = (ulong)uVar7;
      } while (uVar7 < len);
    }
  }
  return bVar6;
}

Assistant:

inline bool utf8ToUnicode(const char * const str, uint len, vector<uint16_t>& vec)
    {
        char ch1, ch2;
        if(!str)
        {
            return false;
        }
        vec.clear();
        for(uint i = 0;i < len;)
        {
            if(!(str[i] & 0x80)) // 0xxxxxxx
            {
                vec.push_back(str[i]);
                i++;
            }
            else if ((unsigned char)str[i] <= 0xdf && i + 1 < len) // 110xxxxxx
            {
                ch1 = (str[i] >> 2) & 0x07;
                ch2 = (str[i+1] & 0x3f) | ((str[i] & 0x03) << 6 );
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 2;
            }
            else if((unsigned char)str[i] <= 0xef && i + 2 < len)
            {
                ch1 = (str[i] << 4) | ((str[i+1] >> 2) & 0x0f );
                ch2 = ((str[i+1]<<6) & 0xc0) | (str[i+2] & 0x3f); 
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 3;
            }
            else
            {
                return false;
            }
        }
        return true;
    }